

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

void nhdp_domain_process_metric_linktlv(nhdp_domain *domain,nhdp_link *lnk,uint8_t *value)

{
  uint32_t uVar1;
  rfc7181_metric_field metric_field;
  ushort local_1a;
  
  local_1a = *(ushort *)value;
  uVar1 = rfc7181_metric_decode(&local_1a);
  if ((char)local_1a < '\0') {
    lnk->_domaindata[domain->index].metric.out = uVar1;
  }
  if ((local_1a & 0x20) != 0) {
    lnk->neigh->_domaindata[domain->index].metric.out = uVar1;
  }
  return;
}

Assistant:

void
nhdp_domain_process_metric_linktlv(struct nhdp_domain *domain, struct nhdp_link *lnk, const uint8_t *value) {
  struct rfc7181_metric_field metric_field;
  uint32_t metric;

  memcpy(&metric_field, value, sizeof(metric_field));
  metric = rfc7181_metric_decode(&metric_field);

  if (rfc7181_metric_has_flag(&metric_field, RFC7181_LINKMETRIC_INCOMING_LINK)) {
    nhdp_domain_get_linkdata(domain, lnk)->metric.out = metric;
  }
  if (rfc7181_metric_has_flag(&metric_field, RFC7181_LINKMETRIC_INCOMING_NEIGH)) {
    nhdp_domain_get_neighbordata(domain, lnk->neigh)->metric.out = metric;
  }
}